

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O0

void __thiscall MultiAgentDecisionProcess::InitializeUnixName(MultiAgentDecisionProcess *this)

{
  long in_RDI;
  string unixName;
  string local_48 [32];
  string local_28 [40];
  
  std::__cxx11::string::find_last_of((char)(in_RDI + 0x88U),0x2f);
  std::__cxx11::string::substr((ulong)local_28,in_RDI + 0x88U);
  std::__cxx11::string::find_last_of((char)local_28,0x2e);
  std::__cxx11::string::substr((ulong)local_48,(ulong)local_28);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xa8),local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void MultiAgentDecisionProcess::InitializeUnixName()
{
    // strip everything before and including the last /
    string unixName=_m_problemFile.substr(_m_problemFile.find_last_of('/') + 1);

    // and after the last .
    _m_unixName=unixName.substr(0,unixName.find_last_of('.'));
}